

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionCallNode *node)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  long *plVar3;
  PrintVisitor visitor;
  undefined **local_48;
  ostream *local_40;
  int local_38;
  undefined4 uStack_34;
  
  poVar2 = this->stream_;
  local_48 = (undefined **)&local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_48,(long)local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"FunctionCallNode:\n",0x12);
  if (local_48 != (undefined **)&local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  poVar2 = this->stream_;
  local_48 = (undefined **)&local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_48,(long)local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Name: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(node->name_)._M_dataplus._M_p,(node->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_48 != (undefined **)&local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  poVar2 = this->stream_;
  local_48 = (undefined **)&local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_48,(long)local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Arguments:\n",0xb);
  if (local_48 != (undefined **)&local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  local_40 = this->stream_;
  local_38 = this->indentation_ + 1;
  local_48 = &PTR__Visitor_001f4310;
  iVar1 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)CONCAT44(extraout_var,iVar1)) {
    (**(code **)(*(long *)plVar3[2] + 0x10))((long *)plVar3[2],&local_48);
  }
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionCallNode& node)
{
  stream_ << indent() << "FunctionCallNode:\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Arguments:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
}